

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8 *puVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < *field; lVar2 = lVar2 + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    puVar1 = output->ptr;
    *(undefined4 *)puVar1 = *(undefined4 *)(*(long *)((long)field + 8) + lVar2 * 4);
    output->ptr = puVar1 + 4;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }